

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveMemory.cpp
# Opt level: O0

void __thiscall wasm::RemoveMemory::run(RemoveMemory *this,Module *module)

{
  anon_class_1_0_00000001 local_39;
  function<bool_(wasm::DataSegment_*)> local_38;
  Module *local_18;
  Module *module_local;
  RemoveMemory *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  std::function<bool(wasm::DataSegment*)>::
  function<wasm::RemoveMemory::run(wasm::Module*)::_lambda(wasm::DataSegment*)_1_,void>
            ((function<bool(wasm::DataSegment*)> *)&local_38,&local_39);
  Module::removeDataSegments(module,&local_38);
  std::function<bool_(wasm::DataSegment_*)>::~function(&local_38);
  return;
}

Assistant:

void run(Module* module) override {
    module->removeDataSegments([&](DataSegment* curr) { return true; });
  }